

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int b64_pton(char *src,uchar *target,size_t targsize)

{
  ushort *puVar1;
  ushort **ppuVar2;
  void *pvVar3;
  char cVar4;
  uchar uVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  
  bVar7 = true;
  uVar8 = 0;
  uVar10 = 0;
  do {
    uVar12 = (ulong)uVar8;
LAB_00102ea3:
    do {
      pcVar11 = src;
      cVar4 = *pcVar11;
      if ((long)cVar4 == 0) {
        if (!bVar7) {
          return -1;
        }
        goto LAB_00102feb;
      }
      src = pcVar11 + 1;
      ppuVar2 = __ctype_b_loc();
      puVar1 = *ppuVar2;
    } while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0);
    if (cVar4 == '=') {
      pcVar6 = pcVar11 + 2;
      if (uVar10 < 2) {
        return -1;
      }
      cVar4 = *src;
      iVar9 = (int)cVar4;
      pcVar11 = pcVar11 + 3;
      if (uVar10 == 2) {
        while( true ) {
          pcVar6 = pcVar11;
          if (cVar4 == '\0') {
            return -1;
          }
          if ((*(byte *)((long)puVar1 + (long)iVar9 * 2 + 1) & 0x20) == 0) break;
          cVar4 = pcVar6[-1];
          iVar9 = (int)cVar4;
          pcVar11 = pcVar6 + 1;
        }
        if (iVar9 != 0x3d) {
          return -1;
        }
        iVar9 = (int)pcVar6[-1];
      }
      while (iVar9 != 0) {
        if ((*(byte *)((long)puVar1 + (long)iVar9 * 2 + 1) & 0x20) == 0) {
          return -1;
        }
        cVar4 = *pcVar6;
        pcVar6 = pcVar6 + 1;
        iVar9 = (int)cVar4;
      }
      if ((target == (uchar *)0x0) || (uVar10 = 0xffffffff, target[uVar12] == '\0')) {
LAB_00102feb:
        uVar10 = uVar8;
      }
      return uVar10;
    }
    pvVar3 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",(int)cVar4,
                    0x41);
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    cVar4 = (char)pvVar3;
    if (uVar10 == 0) {
      uVar10 = 1;
      bVar7 = false;
      if (target != (uchar *)0x0) {
        if (targsize <= uVar12) {
          return -1;
        }
        target[uVar12] = cVar4 << 2;
        bVar7 = false;
      }
      goto LAB_00102ea3;
    }
    if (uVar10 == 1) {
      uVar10 = 2;
      if (target != (uchar *)0x0) {
        if (targsize <= (long)(int)uVar8 + 1U) {
          return -1;
        }
        target[(int)uVar8] = target[(int)uVar8] | (byte)((int)pvVar3 - 0x104540U >> 4);
        uVar5 = cVar4 << 4;
LAB_00102faa:
        target[(long)(int)uVar8 + 1] = uVar5;
      }
LAB_00102fae:
      bVar7 = false;
    }
    else {
      if (uVar10 == 2) {
        uVar10 = 3;
        if (target != (uchar *)0x0) {
          if (targsize <= (long)(int)uVar8 + 1U) {
            return -1;
          }
          target[(int)uVar8] = target[(int)uVar8] | (byte)((int)pvVar3 - 0x104540U >> 2);
          uVar5 = cVar4 << 6;
          goto LAB_00102faa;
        }
        goto LAB_00102fae;
      }
      uVar10 = 0;
      bVar7 = true;
      if (target != (uchar *)0x0) {
        if (targsize <= (ulong)(long)(int)uVar8) {
          return -1;
        }
        target[(int)uVar8] = target[(int)uVar8] | cVar4 - 0x40U;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int
b64_pton(char const *src, unsigned char *target, size_t targsize) {
	int tarindex, state, ch;
	char *pos;

	state = 0;
	tarindex = 0;

	while ((ch = *src++) != '\0') {
		if (isspace(ch))	/* Skip whitespace anywhere. */
			continue;

		if (ch == Pad64)
			break;

		pos = strchr(Base64, ch);
		if (pos == 0) 		/* A non-base64 character. */
			return (-1);

		switch (state) {
		case 0:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] = (pos - Base64) << 2;
			}
			state = 1;
			break;
		case 1:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 4;
				target[tarindex+1]  = ((pos - Base64) & 0x0f)
							<< 4 ;
			}
			tarindex++;
			state = 2;
			break;
		case 2:
			if (target) {
				if ((size_t)tarindex + 1 >= targsize)
					return (-1);
				target[tarindex]   |=  (pos - Base64) >> 2;
				target[tarindex+1]  = ((pos - Base64) & 0x03)
							<< 6;
			}
			tarindex++;
			state = 3;
			break;
		case 3:
			if (target) {
				if ((size_t)tarindex >= targsize)
					return (-1);
				target[tarindex] |= (pos - Base64);
			}
			tarindex++;
			state = 0;
			break;
		default:
			abort();
		}
	}

	/*
	 * We are done decoding Base-64 chars.  Let's see if we ended
	 * on a byte boundary, and/or with erroneous trailing characters.
	 */

	if (ch == Pad64) {		/* We got a pad char. */
		ch = *src++;		/* Skip it, get next. */
		switch (state) {
		case 0:		/* Invalid = in first position */
		case 1:		/* Invalid = in second position */
			return (-1);

		case 2:		/* Valid, means one byte of info */
			/* Skip any number of spaces. */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					break;
			/* Make sure there is another trailing = sign. */
			if (ch != Pad64)
				return (-1);
			ch = *src++;		/* Skip the = */
			/* Fall through to "single trailing =" case. */
			/* FALLTHROUGH */

		case 3:		/* Valid, means two bytes of info */
			/*
			 * We know this char is an =.  Is there anything but
			 * whitespace after it?
			 */
			for ((void)NULL; ch != '\0'; ch = *src++)
				if (!isspace(ch))
					return (-1);

			/*
			 * Now make sure for cases 2 and 3 that the "extra"
			 * bits that slopped past the last full byte were
			 * zeros.  If we don't check them, they become a
			 * subliminal channel.
			 */
			if (target && target[tarindex] != 0)
				return (-1);
		}
	} else {
		/*
		 * We ended by seeing the end of the string.  Make sure we
		 * have no partial bytes lying around.
		 */
		if (state != 0)
			return (-1);
	}

	return (tarindex);
}